

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetCurrentNetwork(Registry *this,Network *aRet)

{
  Status SVar1;
  int iVar2;
  Status local_a9;
  bool local_89;
  Network local_88;
  NetworkId local_24;
  Network *pNStack_20;
  NetworkId networkId;
  Network *aRet_local;
  Registry *this_local;
  
  pNStack_20 = aRet;
  if (this->mStorage == (PersistentStorage *)0x0) {
    __assert_fail("mStorage != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry.cpp"
                  ,0x23c,
                  "Registry::Status ot::commissioner::persistent_storage::Registry::GetCurrentNetwork(Network &)"
                 );
  }
  NetworkId::NetworkId(&local_24);
  iVar2 = (*this->mStorage->_vptr_PersistentStorage[0x1d])(this->mStorage,&local_24);
  SVar1 = anon_unknown_0::MapStatus((Status)iVar2);
  if (SVar1 == kSuccess) {
    if (local_24.mId != 0xffffffff) {
      iVar2 = (*this->mStorage->_vptr_PersistentStorage[0xe])(this->mStorage,&local_24,pNStack_20);
      local_a9 = anon_unknown_0::MapStatus((Status)iVar2);
    }
    else {
      Network::Network(&local_88);
      Network::operator=(pNStack_20,&local_88);
      local_a9 = kSuccess;
    }
    local_89 = local_24.mId == 0xffffffff;
    this_local._7_1_ = local_a9;
    if (local_89) {
      Network::~Network(&local_88);
    }
  }
  else {
    this_local._7_1_ = kError;
  }
  return this_local._7_1_;
}

Assistant:

Registry::Status Registry::GetCurrentNetwork(Network &aRet)
{
    assert(mStorage != nullptr);
    NetworkId networkId;
    if (MapStatus(mStorage->GetCurrentNetwork(networkId)) != Registry::Status::kSuccess)
    {
        return Registry::Status::kError;
    }

    return (networkId.mId == EMPTY_ID) ? (aRet = Network{}, Registry::Status::kSuccess)
                                       : MapStatus(mStorage->Get(networkId, aRet));
}